

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O2

uint64_t GDSfloatCalc(double inVar)

{
  ulong uVar1;
  byte bVar2;
  int i;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int i_1;
  double dVar6;
  undefined1 auVar7 [16];
  
  if ((inVar == 0.0) && (!NAN(inVar))) {
    return 0;
  }
  dVar6 = -inVar;
  if (-inVar <= inVar) {
    dVar6 = inVar;
  }
  uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
  auVar7._8_4_ = (int)(uVar4 >> 0x20);
  auVar7._0_8_ = uVar4;
  auVar7._12_4_ = 0x45300000;
  dVar6 = dVar6 - ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
  iVar3 = 0x3f;
  uVar5 = 0;
  do {
    if (iVar3 < 0) break;
    dVar6 = dVar6 + dVar6;
    uVar1 = 0;
    if (1.0 <= dVar6) {
      uVar1 = 1L << ((byte)iVar3 & 0x3f);
    }
    uVar5 = uVar5 | uVar1;
    dVar6 = (double)((ulong)dVar6 & -(ulong)(dVar6 < 1.0) |
                    ~-(ulong)(dVar6 < 1.0) & (ulong)(dVar6 + -1.0));
    iVar3 = iVar3 + -1;
  } while ((dVar6 != 0.0) || (NAN(dVar6)));
  iVar3 = 0xf;
  uVar1 = 0x5000000000000000;
  bVar2 = 0x3c;
  while( true ) {
    if ((iVar3 < 0) || (uVar4 >> 0x3b != 0)) break;
    uVar4 = uVar4 << 4 | (ulong)((uint)(uVar5 >> (bVar2 & 0x3f)) & 0xf);
    iVar3 = iVar3 + -1;
    uVar1 = uVar1 + 0xff00000000000000;
    bVar2 = bVar2 - 4;
  }
  return uVar1 | uVar4 >> 8 | (ulong)(inVar < 0.0) << 0x3f;
}

Assistant:

uint64_t GDSfloatCalc(double inVar)
{
  uint64_t GDSdec = 0;
  unsigned long long integral;
  double deci;
  unsigned long long sign = 0;
  unsigned long long exponent = 80;
  unsigned long long mantissa = 0;

  if (inVar == 0)
    return 0;

  if (inVar < 0) {
    inVar *= -1;
    sign = 1;
  }

  integral = inVar;
  deci = inVar - integral;

  // Calculating the decimal
  for (int i = 63; i >= 0; i--) {
    deci *= 2;
    if (deci >= 1) {
      GDSdec = GDSdec | bitShiftL(1, i);
      deci--;
    }
    if (deci == 0)
      break;
  }

  mantissa = integral;
  for (int i = 15; i >= 0; i--) {
    if ((bitShiftR(mantissa, 59) & 0xffff) > 0)
      break;
    mantissa = mantissa << 4;
    exponent--;
    mantissa = mantissa | (bitShiftR(GDSdec, 4 * i) & 0xf);
  }

  sign = bitShiftL(sign, 63);
  exponent = bitShiftL(exponent, 56);
  mantissa = bitShiftR(mantissa, 8);

  return sign | exponent | mantissa;
}